

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Elt_pointer pNVar1;
  _Elt_pointer pTVar2;
  pointer pvVar3;
  pointer pTVar4;
  _Elt_pointer pNVar5;
  nodeId_t v;
  ostream *poVar6;
  Diagramm *this;
  deque<van_kampen::Node,_std::allocator<van_kampen::Node>_> *pdVar7;
  mapped_type *pmVar8;
  Node *pNVar9;
  deque<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> *pdVar10;
  size_type sVar11;
  invalid_argument *piVar12;
  int curColor;
  undefined8 uVar13;
  char *pcVar14;
  long *plVar15;
  Graph *pGVar16;
  size_t i;
  ulong uVar17;
  _Elt_pointer pTVar18;
  unsigned_long __val;
  _Elt_pointer this_00;
  long lVar19;
  _Elt_pointer __k;
  Graph *pGVar20;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *in_stack_fffffffffffff8f0;
  _Map_pointer local_700;
  _Map_pointer local_6f8;
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  words;
  _Map_pointer local_6d0;
  _Elt_pointer local_6c8;
  _Map_pointer local_6c0;
  _Elt_pointer local_6b8;
  vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_> word;
  Graph *local_690;
  _Map_pointer local_688;
  Graph *local_680;
  Graph *local_678;
  _Map_pointer local_668;
  value_type hub;
  undefined1 local_630 [8];
  GroupElement local_628;
  bool local_600;
  double local_5f8;
  bool local_5f0;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  newNames;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  color;
  nodeId_t from;
  string text;
  ConsoleFlags flags;
  string local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  ofstream wordOutputFile;
  undefined4 uStack_434;
  size_t local_430;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  _Elt_pointer local_418;
  _Map_pointer local_410;
  _Elt_pointer local_408;
  ifstream inputFile;
  int aiStack_218 [50];
  undefined8 auStack_150 [36];
  
  van_kampen::ConsoleFlags::ConsoleFlags(&flags,argc,argv);
  std::ifstream::ifstream(&inputFile,(string *)&flags,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(_inputFile + -0x18)) != 0) {
    piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&word,
                   "cannot open \'",&flags.inputFileName);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &wordOutputFile,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&word,"\'");
    std::invalid_argument::invalid_argument(piVar12,(string *)&wordOutputFile);
    __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  text._M_dataplus._M_p = (pointer)&text.field_2;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&text,*(undefined8 *)((long)auStack_150 + *(long *)(_inputFile + -0x18)),
             0xffffffffffffffff,0,0xffffffff);
  van_kampen::GroupRepresentationParser::parse(&words,&text);
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::vector
            (&hub,words.
                  super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1);
  lVar19 = 0x28;
  if (flags.quiet == false) {
    poVar6 = std::operator<<((ostream *)&std::clog,"Total relations count: ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::endl<char,std::char_traits<char>>(poVar6);
    poVar6 = std::operator<<((ostream *)&std::clog,"Hub size: ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  words.
  super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       words.
       super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -1;
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::~vector
            (words.
             super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (flags.shuffleGroup == true) {
    std::
    random_shuffle<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>*,std::vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>>>
              ((__normal_iterator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>
                )words.
                 super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>
                )words.
                 super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
  }
  pvVar3 = words.
           super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (flags.notSort == false) {
    if (words.
        super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        words.
        super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>,_std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>
      ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>,_std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>
                           *)&wordOutputFile,
                          (__normal_iterator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>
                           )words.
                            super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                          (((long)words.
                                  super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)words.
                                 super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18 + 1) / 2);
      if ((_Elt_pointer)local_428._M_allocated_capacity == (_Elt_pointer)0x0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>*,std::vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                  (words.
                   super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,pvVar3);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>*,std::vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>>,std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                  (words.
                   super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,pvVar3,local_428._M_allocated_capacity,
                   local_430);
      }
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>,_std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>
      ::~_Temporary_buffer
                ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_*,_std::vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>_>,_std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>
                  *)&wordOutputFile);
    }
  }
  std::
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  ::push_back(&words,&hub);
  if (flags.iterativeAlgo == true) {
    std::make_unique<van_kampen::IterativeAlgorithm>();
  }
  else {
    if (flags.mergingAlgo != true) {
      if (flags.largeFirstAlgo == true) {
        std::make_unique<van_kampen::LargeFirstAlgorithm>();
        plVar15 = (long *)CONCAT44(uStack_434,_wordOutputFile);
        plVar15[3] = flags.cellsLimit;
        *(bool *)(plVar15 + 4) = flags.quiet;
        *(undefined4 *)((long)plVar15 + 0x24) = (undefined4)flags.perLarge;
      }
      else {
        plVar15 = (long *)0x0;
      }
      goto LAB_0013edf0;
    }
    std::make_unique<van_kampen::MergingAlgorithm>();
  }
  plVar15 = (long *)CONCAT44(uStack_434,_wordOutputFile);
  plVar15[3] = flags.cellsLimit;
  *(bool *)(plVar15 + 4) = flags.quiet;
LAB_0013edf0:
  (**(code **)*plVar15)(plVar15,&words);
  std::ofstream::ofstream(&wordOutputFile,(string *)&flags.wordOutputFileName,_S_out);
  if (*(int *)((long)&local_418 + *(long *)(CONCAT44(uStack_434,_wordOutputFile) + -0x18)) == 0) {
    this = (Diagramm *)(**(code **)(*plVar15 + 8))();
    van_kampen::Diagramm::getCircuit(&word,this);
    for (uVar17 = 0;
        pTVar4 = word.
                 super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar17 < (ulong)(((long)word.
                                super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)word.
                               super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x48);
        uVar17 = uVar17 + 1) {
      poVar6 = std::operator<<((ostream *)&wordOutputFile,
                               (string *)
                               ((long)word.
                                      super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar19 + -0x20));
      pcVar14 = "";
      if (*(char *)((long)&pTVar4->to + lVar19) != '\0') {
        pcVar14 = "^(-1)";
      }
      std::operator<<(poVar6,pcVar14);
      if (uVar17 < ((long)word.
                          super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)word.
                         super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x48 - 1U) {
        std::operator<<((ostream *)&wordOutputFile,"*");
      }
      lVar19 = lVar19 + 0x48;
    }
    std::vector<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>::~vector(&word);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"cannot write to file \'");
    poVar6 = std::operator<<(poVar6,(string *)&flags.wordOutputFileName);
    poVar6 = std::operator<<(poVar6,"\'");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::ofstream::~ofstream(&wordOutputFile);
  if (flags.split == false) {
    std::ofstream::ofstream(&wordOutputFile,(string *)&flags.outputFileName,_S_out);
    if (*(int *)((long)&local_418 + *(long *)(CONCAT44(uStack_434,_wordOutputFile) + -0x18)) != 0) {
      piVar12 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_630,
                     "cannot write to file \'",&flags.outputFileName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&word,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_630,
                     "\'");
      std::invalid_argument::invalid_argument(piVar12,(string *)&word);
      __cxa_throw(piVar12,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    van_kampen::Graph::printSelf((Graph *)plVar15[1],(ostream *)&wordOutputFile,flags.outputFormat);
    std::ofstream::~ofstream(&wordOutputFile);
  }
  else {
    pGVar20 = (Graph *)plVar15[1];
    color._M_h._M_buckets = &color._M_h._M_single_bucket;
    color._M_h._M_bucket_count = 1;
    color._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    color._M_h._M_element_count = 0;
    color._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    color._M_h._M_rehash_policy._M_next_resize = 0;
    color._M_h._M_single_bucket = (__node_base_ptr)0x0;
    std::_Deque_base<van_kampen::Graph,_std::allocator<van_kampen::Graph>_>::_Deque_base
              ((_Deque_base<van_kampen::Graph,_std::allocator<van_kampen::Graph>_> *)&word);
    pdVar7 = van_kampen::Graph::nodes(pGVar20);
    this_00 = (pdVar7->super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    local_6c8 = (pdVar7->super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
                _M_impl.super__Deque_impl_data._M_start._M_last;
    local_6d0 = (pdVar7->super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
                _M_impl.super__Deque_impl_data._M_start._M_node;
    pNVar1 = (pdVar7->super__Deque_base<van_kampen::Node,_std::allocator<van_kampen::Node>_>).
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    curColor = 1;
    while (this_00 != pNVar1) {
      _wordOutputFile = van_kampen::Node::getId(this_00);
      pmVar8 = std::__detail::
               _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&color,(key_type *)&wordOutputFile);
      if (*pmVar8 == 0) {
        memset((Graph *)&wordOutputFile,0,0x88);
        van_kampen::Graph::Graph((Graph *)&wordOutputFile);
        std::deque<van_kampen::Graph,_std::allocator<van_kampen::Graph>_>::
        emplace_back<van_kampen::Graph>
                  ((deque<van_kampen::Graph,_std::allocator<van_kampen::Graph>_> *)&word,
                   (Graph *)&wordOutputFile);
        van_kampen::Graph::~Graph((Graph *)&wordOutputFile);
        newNames._M_h._M_buckets = &newNames._M_h._M_single_bucket;
        newNames._M_h._M_bucket_count = 1;
        newNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        newNames._M_h._M_element_count = 0;
        newNames._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        newNames._M_h._M_rehash_policy._M_next_resize = 0;
        newNames._M_h._M_single_bucket = (__node_base_ptr)0x0;
        std::_Deque_base<int,_std::allocator<int>_>::_Deque_base
                  ((_Deque_base<int,_std::allocator<int>_> *)&wordOutputFile);
        v = van_kampen::Node::getId(this_00);
        pGVar16 = local_680;
        if (local_680 == local_678) {
          pGVar16 = local_668[-1] + 3;
        }
        van_kampen::details::dfs<main::__1>
                  (v,pGVar20,&color,curColor,pGVar16 + -1,
                   (deque<int,_std::allocator<int>_> *)&wordOutputFile,
                   (anon_class_1_0_00000001 *)&newNames._M_h,in_stack_fffffffffffff8f0);
        pNVar5 = local_408;
        curColor = curColor + 1;
        local_6b8 = local_418;
        local_6c0 = local_410;
        uVar13 = local_428._M_allocated_capacity;
        while ((_Elt_pointer)uVar13 != pNVar5) {
          from = *(nodeId_t *)
                  &(((_Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                      *)&((_Elt_pointer)uVar13)->position)->_M_impl).super__Vector_impl_data.
                   _M_start;
          pNVar9 = van_kampen::Graph::node(pGVar20,from);
          pdVar10 = van_kampen::Node::transitions(pNVar9);
          __k = (pdVar10->
                super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>).
                _M_impl.super__Deque_impl_data._M_start._M_cur;
          pTVar18 = (pdVar10->
                    super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                    )._M_impl.super__Deque_impl_data._M_start._M_last;
          local_6f8 = (pdVar10->
                      super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                      )._M_impl.super__Deque_impl_data._M_start._M_node;
          pTVar2 = (pdVar10->
                   super__Deque_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                   )._M_impl.super__Deque_impl_data._M_finish._M_cur;
          while (__k != pTVar2) {
            if (0.01 <= __k->priority) {
              pGVar16 = local_680;
              if (local_680 == local_678) {
                pGVar16 = local_668[-1] + 3;
              }
              pmVar8 = std::__detail::
                       _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&newNames._M_h,&from);
              pNVar9 = van_kampen::Graph::node(pGVar16 + -1,*pmVar8);
              pmVar8 = std::__detail::
                       _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&newNames._M_h,&__k->to);
              local_630._0_4_ = *pmVar8;
              van_kampen::GroupElement::GroupElement((GroupElement *)(local_630 + 8),&__k->label);
              local_600 = __k->isInSquare;
              local_5f8 = __k->priority;
              local_5f0 = __k->isInHub;
              van_kampen::Node::addTransition(pNVar9,(Transition *)local_630);
              std::__cxx11::string::~string((string *)(local_630 + 8));
            }
            __k = __k + 1;
            if (__k == pTVar18) {
              __k = local_6f8[1];
              local_6f8 = local_6f8 + 1;
              pTVar18 = __k + 7;
            }
          }
          uVar13 = (long)&(((_Vector_base<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>
                             *)&((_Elt_pointer)uVar13)->position)->_M_impl).super__Vector_impl_data.
                          _M_start + 4;
          if ((_Elt_pointer)uVar13 == local_6b8) {
            uVar13 = local_6c0[1];
            local_6c0 = local_6c0 + 1;
            local_6b8 = (_Elt_pointer)
                        ((long)&(((_Elt_pointer)(uVar13 + 0x170))->label_).field_2 + 8);
          }
        }
        std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
                  ((_Deque_base<int,_std::allocator<int>_> *)&wordOutputFile);
        std::
        _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&newNames._M_h);
      }
      this_00 = this_00 + 1;
      if (this_00 == local_6c8) {
        this_00 = local_6d0[1];
        local_6d0 = local_6d0 + 1;
        local_6c8 = this_00 + 2;
      }
    }
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&color._M_h);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)&wordOutputFile,&flags.outputFileNameWoEx,auto_format);
    std::filesystem::create_directory((path *)&wordOutputFile);
    std::filesystem::__cxx11::path::~path((path *)&wordOutputFile);
    local_700 = local_688;
    __val = 1;
    pGVar20 = (Graph *)word.
                       super__Vector_base<van_kampen::Transition,_std::allocator<van_kampen::Transition>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
    while (pGVar20 != local_680) {
      pdVar7 = van_kampen::Graph::nodes(pGVar20);
      sVar11 = std::deque<van_kampen::Node,_std::allocator<van_kampen::Node>_>::size(pdVar7);
      if (1 < sVar11) {
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  ((path *)&color,&flags.outputFileNameWoEx,auto_format);
        std::__cxx11::to_string(&local_478,__val);
        std::operator+(&local_458,&local_478,".");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&from,
                       &local_458,&flags.outputFormatString);
        std::filesystem::__cxx11::path::path
                  ((path *)&newNames,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&from,
                   auto_format);
        std::filesystem::__cxx11::operator/((path *)local_630,(path *)&color,(path *)&newNames);
        std::ofstream::ofstream
                  ((ostream *)&wordOutputFile,(char *)CONCAT44(local_630._4_4_,local_630._0_4_),
                   _S_out);
        std::filesystem::__cxx11::path::~path((path *)local_630);
        std::filesystem::__cxx11::path::~path((path *)&newNames);
        std::__cxx11::string::~string((string *)&from);
        std::__cxx11::string::~string((string *)&local_458);
        std::__cxx11::string::~string((string *)&local_478);
        std::filesystem::__cxx11::path::~path((path *)&color);
        van_kampen::Graph::printSelf(pGVar20,(ostream *)&wordOutputFile,flags.outputFormat);
        __val = __val + 1;
        std::ofstream::~ofstream((ostream *)&wordOutputFile);
      }
      pGVar20 = pGVar20 + 1;
      if (pGVar20 == local_690) {
        pGVar20 = local_700[1];
        local_700 = local_700 + 1;
        local_690 = pGVar20 + 3;
      }
    }
    std::deque<van_kampen::Graph,_std::allocator<van_kampen::Graph>_>::~deque
              ((deque<van_kampen::Graph,_std::allocator<van_kampen::Graph>_> *)&word);
  }
  (**(code **)(*plVar15 + 0x18))();
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::~vector(&hub);
  std::
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  ::~vector(&words);
  std::__cxx11::string::~string((string *)&text);
  std::ifstream::~ifstream(&inputFile);
  van_kampen::ConsoleFlags::~ConsoleFlags(&flags);
  return 0;
}

Assistant:

int main(int argc, const char **argv)
{
    using namespace van_kampen;

    try
    {
        van_kampen::ConsoleFlags flags(argc, argv);
        std::ifstream inputFile(flags.inputFileName);
        if (!inputFile.good())
        {
            throw std::invalid_argument("cannot open '" + flags.inputFileName + "'");
        }
        std::string text((std::istreambuf_iterator<char>(inputFile)),
                         std::istreambuf_iterator<char>());

        std::vector<std::vector<van_kampen::GroupElement>> words = van_kampen::GroupRepresentationParser::parse(text);
        auto hub = words.back();
        if (!flags.quiet)
        {
            std::clog << "Total relations count: " << words.size() << std::endl;
            std::clog << "Hub size: " << hub.size() << std::endl;
        }
        words.pop_back();
        if (flags.shuffleGroup)
        {
            std::random_shuffle(words.begin(), words.end());
        }
        if (!flags.notSort)
        {
            std::stable_sort(words.begin(),
                             words.end(),
                             [](const std::vector<van_kampen::GroupElement> &a, const std::vector<van_kampen::GroupElement> &b) {
                                 return a.size() < b.size();
                             });
        }
        words.push_back(hub);
        std::unique_ptr<DiagrammGeneratingAlgorithm> algo;
        if (flags.iterativeAlgo)
        {
            auto iterative = std::make_unique<IterativeAlgorithm>();
            iterative->cellsLimit = flags.cellsLimit;
            iterative->quiet = flags.quiet;
            algo.reset(iterative.release());
        }
        else if (flags.mergingAlgo)
        {
            auto merging = std::make_unique<MergingAlgorithm>();
            merging->limit = flags.cellsLimit;
            merging->quiet = flags.quiet;
            algo.reset(merging.release());
        }
        else if (flags.largeFirstAlgo)
        {
            auto largeFirst = std::make_unique<LargeFirstAlgorithm>();
            largeFirst->cellsLimit = flags.cellsLimit;
            largeFirst->quiet = flags.quiet;
            largeFirst->maximalSmallForOneBig = flags.perLarge;
            algo.reset(largeFirst.release());
        }

        algo->generate(words);

        {
            std::ofstream wordOutputFile(flags.wordOutputFileName);
            if (!wordOutputFile.good())
            {
                std::cerr << "cannot write to file '" << flags.wordOutputFileName << "'" << std::endl;
            }
            else
            {
                std::vector<van_kampen::Transition> word = algo->diagramm().getCircuit();
                for (std::size_t i = 0; i < word.size(); ++i)
                {
                    auto &letter = word[i];
                    wordOutputFile << letter.label.name << (letter.label.reversed ? "^(-1)" : "");
                    if (i < word.size() - 1)
                    {
                        wordOutputFile << "*";
                    }
                }
            }
        }


        if (!flags.split)
        {
            std::ofstream outFile(flags.outputFileName);
            if (!outFile.good())
            {
                throw std::invalid_argument("cannot write to file '" + flags.outputFileName + "'");
            }
            algo->graph().printSelf(outFile, flags.outputFormat);
        }
        else
        {
            std::deque<van_kampen::Graph> comps = splitToStrongComponents(algo->graph(), [](const Transition &tr) {
                return tr.priority >= 0.01;
            });
            std::filesystem::create_directory(flags.outputFileNameWoEx);
            std::size_t compId = 1;
            for (const van_kampen::Graph &comp : comps)
            {
                if (comp.nodes().size() < 2)
                    continue;
                std::ofstream outFile(std::filesystem::path(flags.outputFileNameWoEx) / (std::to_string(compId) + "." + flags.outputFormatString));
                comp.printSelf(outFile, flags.outputFormat);
                ++compId;
            }
        }
    }
    catch (const std::exception &e)
    {
        std::cerr << e.what() << '\n';
        return 0;
    }
}